

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O0

void WebRtcIsacBw_GetBandwidthInfo
               (BwEstimatorstr *bwest_str,IsacSamplingRate decoder_sample_rate_hz,
               IsacBandwidthInfo *bwinfo)

{
  int32_t iVar1;
  IsacBandwidthInfo *bwinfo_local;
  IsacSamplingRate decoder_sample_rate_hz_local;
  BwEstimatorstr *bwest_str_local;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    bwinfo->in_use = 1;
    iVar1 = WebRtcIsac_GetUplinkBandwidth(bwest_str);
    bwinfo->send_bw_avg = iVar1;
    iVar1 = WebRtcIsac_GetUplinkMaxDelay(bwest_str);
    bwinfo->send_max_delay_avg = iVar1;
    WebRtcIsac_GetDownlinkBwJitIndexImpl
              (bwest_str,&bwinfo->bottleneck_idx,&bwinfo->jitter_info,decoder_sample_rate_hz);
    return;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x30d,
                "void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr *, enum IsacSamplingRate, IsacBandwidthInfo *)"
               );
}

Assistant:

void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr* bwest_str,
                                   enum IsacSamplingRate decoder_sample_rate_hz,
                                   IsacBandwidthInfo* bwinfo) {
  assert(!bwest_str->external_bw_info.in_use);
  bwinfo->in_use = 1;
  bwinfo->send_bw_avg = WebRtcIsac_GetUplinkBandwidth(bwest_str);
  bwinfo->send_max_delay_avg = WebRtcIsac_GetUplinkMaxDelay(bwest_str);
  WebRtcIsac_GetDownlinkBwJitIndexImpl(bwest_str, &bwinfo->bottleneck_idx,
                                       &bwinfo->jitter_info,
                                       decoder_sample_rate_hz);
}